

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *this_00;
  int64_t iVar1;
  real *prVar2;
  size_type sVar3;
  reference pvVar4;
  iterator iVar5;
  iterator __last;
  Vector *in_RDX;
  int in_ESI;
  float in_XMM0_Da;
  int32_t i;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  real in_stack_ffffffffffffffac;
  iterator in_stack_ffffffffffffffc0;
  int local_24;
  
  local_24 = 0;
  do {
    this_00 = (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
              (long)local_24;
    iVar1 = Vector::size((Vector *)0x188d49);
    if (iVar1 <= (long)this_00) {
      return;
    }
    prVar2 = Vector::operator[](in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
    if (in_XMM0_Da <= *prVar2) {
      sVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_RDX);
      if (sVar3 == (long)in_ESI) {
        Vector::operator[](in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffac = std_log(0.0);
        pvVar4 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                           ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             *)in_stack_ffffffffffffffa0);
        if (in_stack_ffffffffffffffac < pvVar4->first) goto LAB_00188e93;
      }
      in_stack_ffffffffffffffa0 = in_RDX;
      Vector::operator[](in_RDX,(int64_t)in_stack_ffffffffffffff98);
      std_log(0.0);
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<float,int&>
                (this_00,(float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (int *)in_stack_ffffffffffffffa0);
      iVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        (in_stack_ffffffffffffff98);
      __last = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                         (in_stack_ffffffffffffff98);
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar5._M_current,
                 (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )__last._M_current,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)
                 in_stack_ffffffffffffffc0._M_current);
      sVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_RDX);
      if ((ulong)(long)in_ESI < sVar3) {
        in_stack_ffffffffffffffc0 =
             std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                       (in_stack_ffffffffffffff98);
        iVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                          (in_stack_ffffffffffffff98);
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )in_stack_ffffffffffffffc0._M_current,
                   (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )iVar5._M_current,
                   (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)this_00);
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x188e91);
      }
    }
LAB_00188e93:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.emplace_back(std_log(output[i]), i);
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}